

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestPicker::~TestPicker(TestPicker *this)

{
  *(undefined ***)this = &PTR_metaObject_0019a2b8;
  QFont::~QFont(&this->m_font);
  *(code **)&this->m_model = QColor::convertTo;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&this->field_0x48);
  QAbstractListModel::~QAbstractListModel((QAbstractListModel *)&this->m_model);
  QSharedPointer<QtMWidgets::Picker>::deref((this->m_picker).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_data).d);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

Q_OBJECT

private slots:

	void initTestCase()
	{
		m_data.append( QStringLiteral( "English" ) );
		m_data.append( QStringLiteral( "Russian" ) );
		m_data.append( QStringLiteral( "German" ) );
		m_data.append( QStringLiteral( "Spanish" ) );
		m_data.append( QStringLiteral( "Portuguese" ) );
		m_data.append( QStringLiteral( "Belorussian" ) );
		m_data.append( QStringLiteral( "Polish" ) );
		m_data.append( QStringLiteral( "Ukrainian" ) );

		m_model.setStringList( m_data );

		m_picker.reset( new QtMWidgets::Picker );

		m_picker->setMouseTracking( true );

		for( int i = 0; i < m_data.size(); ++i )
			m_picker->addItem( m_data.at( i ) );

		m_font = m_picker->font();
		m_font.setBold( true );
		m_font.setPixelSize( 15 );

		m_picker->setFont( m_font );

		m_picker->show();

		QVERIFY( QTest::qWaitForWindowActive( m_picker.data() ) );

		QFontMetrics fm( m_font );
		m_lineHeight = fm.boundingRect( QStringLiteral( "A" ) ).height();

		m_delta = QPoint( 0, - ( m_lineHeight + m_lineHeight / 3 ) );
	}